

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

transformation_t *
opengv::absolute_pose::epnp
          (transformation_t *__return_storage_ptr__,AbsoluteAdapterBase *adapter,Indices *indices)

{
  int r;
  int iVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  size_t i;
  ulong uVar6;
  double *pdVar7;
  double (*R) [3];
  translation_t translation;
  double t_epnp [3];
  rotation_t rotation;
  double R_epnp [3] [3];
  Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> local_178;
  Epnp PnP;
  
  modules::Epnp::Epnp(&PnP);
  modules::Epnp::set_maximum_number_of_correspondences(&PnP,(int)indices->_numberCorrespondences);
  modules::Epnp::reset_correspondences(&PnP);
  pdVar7 = (double *)&rotation;
  lVar4 = 0;
  for (uVar6 = 0; uVar6 < indices->_numberCorrespondences; uVar6 = uVar6 + 1) {
    iVar5 = (int)uVar6;
    iVar1 = iVar5;
    if (indices->_useIndices != false) {
      iVar1 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + (lVar4 >> 0x1e));
    }
    (*adapter->_vptr_AbsoluteAdapterBase[6])(R_epnp,adapter,(long)iVar1);
    if (indices->_useIndices != false) {
      iVar5 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + (lVar4 >> 0x1e));
    }
    (*adapter->_vptr_AbsoluteAdapterBase[2])(pdVar7,adapter,(long)iVar5);
    modules::Epnp::add_correspondence
              (&PnP,R_epnp[0][0],R_epnp[0][1],R_epnp[0][2],
               rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0],
               rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1],
               rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2]);
    lVar4 = lVar4 + 0x100000000;
  }
  R = R_epnp;
  modules::Epnp::compute_pose(&PnP,R,t_epnp);
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    pdVar2 = pdVar7;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      *pdVar2 = (*R)[lVar3];
      pdVar2 = pdVar2 + 3;
    }
    R = R + 1;
    pdVar7 = pdVar7 + 1;
  }
  translation.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = t_epnp[0];
  translation.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = t_epnp[1];
  translation.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = t_epnp[2];
  Eigen::internal::inplace_transpose_selector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_true,_false>::
  run(&rotation);
  local_178.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_xpr =
       (XprTypeNested)&translation;
  local_178.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_0>.m_data =
       (PointerType)&rotation;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             local_178.
             super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_xpr,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
              *)&local_178);
  local_178.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_0>.m_data =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
       m_storage.m_data.array + 9;
  local_178.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_startRow.m_value =
       0;
  local_178.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_startCol.m_value =
       3;
  local_178.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_outerStride = 3;
  local_178.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_xpr =
       __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_178,&translation);
  local_178.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_startRow.m_value =
       0;
  local_178.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_startCol.m_value =
       0;
  local_178.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_outerStride = 3;
  local_178.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_0>.m_data =
       (PointerType)__return_storage_ptr__;
  local_178.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_xpr =
       __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>,Eigen::Matrix<double,3,3,0,3,3>>
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)&local_178,&rotation);
  modules::Epnp::~Epnp(&PnP);
  return __return_storage_ptr__;
}

Assistant:

transformation_t epnp(
    const AbsoluteAdapterBase & adapter,
    const Indices & indices )
{
  //starting from 4 points, we have a unique solution
  assert(indices.size() > 5);

  modules::Epnp PnP;
  PnP.set_maximum_number_of_correspondences(indices.size());
  PnP.reset_correspondences();

  for( size_t i = 0; i < indices.size(); i++ )
  {
    point_t p = adapter.getPoint(indices[i]);
    bearingVector_t f = adapter.getBearingVector(indices[i]);
    PnP.add_correspondence(p[0], p[1], p[2], f[0], f[1], f[2]);
  }

  double R_epnp[3][3], t_epnp[3];
  PnP.compute_pose(R_epnp, t_epnp);

  rotation_t rotation;
  translation_t translation;

  for(int r = 0; r < 3; r++)
  {
    for(int c = 0; c < 3; c++)
      rotation(r,c) = R_epnp[r][c];
  }

  translation[0] = t_epnp[0];
  translation[1] = t_epnp[1];
  translation[2] = t_epnp[2];

  //take inverse transformation
  rotation.transposeInPlace();
  translation = -rotation * translation;

  transformation_t transformation;
  transformation.col(3) = translation;
  transformation.block<3,3>(0,0) = rotation;
  return transformation;
}